

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O0

UniValue * NormalizeOutputs(UniValue *outputs_in)

{
  bool bVar1;
  undefined1 uVar2;
  UniValue *obj;
  undefined8 uVar3;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *output;
  size_t i;
  bool outputs_is_obj;
  UniValue *outputs;
  UniValue outputs_dict;
  UniValue *in_stack_fffffffffffffe08;
  UniValue *in_stack_fffffffffffffe10;
  UniValue *in_stack_fffffffffffffe18;
  UniValue *in_stack_fffffffffffffe20;
  UniValue *in_stack_fffffffffffffe28;
  UniValue *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  string *in_stack_fffffffffffffe48;
  UniValue *message;
  char *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  UniValue *this;
  UniValue *local_168;
  UniValue local_a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = UniValue::isNull(in_stack_fffffffffffffe08);
  if (bVar1) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
               (allocator<char> *)in_stack_fffffffffffffe48);
    JSONRPCError((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    bVar1 = UniValue::isObject(in_stack_fffffffffffffe08);
    if (bVar1) {
      UniValue::get_obj(in_stack_fffffffffffffe10);
    }
    else {
      UniValue::get_array(in_stack_fffffffffffffe10);
    }
    UniValue::UniValue((UniValue *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe30);
    if (!bVar1) {
      this = &local_a0;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe20);
      UniValue::UniValue(in_stack_fffffffffffffe28,(VType)((ulong)in_stack_fffffffffffffe20 >> 0x20)
                         ,(string *)in_stack_fffffffffffffe18);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe08);
      local_168 = (UniValue *)0x0;
      while (message = local_168, obj = (UniValue *)UniValue::size(in_stack_fffffffffffffe08),
            message < obj) {
        UniValue::operator[](in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
        uVar2 = UniValue::isObject(in_stack_fffffffffffffe08);
        if (!(bool)uVar2) {
          uVar3 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)obj,(allocator<char> *)message);
          JSONRPCError((int)((ulong)this >> 0x20),(string *)message);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_006b85e8;
        }
        in_stack_fffffffffffffe20 = (UniValue *)UniValue::size(in_stack_fffffffffffffe08);
        if (in_stack_fffffffffffffe20 != (UniValue *)0x1) {
          uVar3 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)obj,(allocator<char> *)message);
          JSONRPCError((int)((ulong)this >> 0x20),(string *)message);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_006b85e8;
        }
        UniValue::UniValue((UniValue *)CONCAT17(uVar2,in_stack_fffffffffffffe38),
                           in_stack_fffffffffffffe30);
        UniValue::pushKVs(this,obj);
        UniValue::~UniValue(in_stack_fffffffffffffe08);
        local_168 = (UniValue *)((long)&((_Alloc_hider *)&local_168->typ)->_M_p + 1);
      }
      UniValue::operator=(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      UniValue::~UniValue(in_stack_fffffffffffffe08);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return in_RDI;
    }
  }
LAB_006b85e8:
  __stack_chk_fail();
}

Assistant:

UniValue NormalizeOutputs(const UniValue& outputs_in)
{
    if (outputs_in.isNull()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, output argument must be non-null");
    }

    const bool outputs_is_obj = outputs_in.isObject();
    UniValue outputs = outputs_is_obj ? outputs_in.get_obj() : outputs_in.get_array();

    if (!outputs_is_obj) {
        // Translate array of key-value pairs into dict
        UniValue outputs_dict = UniValue(UniValue::VOBJ);
        for (size_t i = 0; i < outputs.size(); ++i) {
            const UniValue& output = outputs[i];
            if (!output.isObject()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, key-value pair not an object as expected");
            }
            if (output.size() != 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, key-value pair must contain exactly one key");
            }
            outputs_dict.pushKVs(output);
        }
        outputs = std::move(outputs_dict);
    }
    return outputs;
}